

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall
QDomEntityPrivate::QDomEntityPrivate(QDomEntityPrivate *this,QDomEntityPrivate *n,bool deep)

{
  QDomNodePrivate::QDomNodePrivate(&this->super_QDomNodePrivate,&n->super_QDomNodePrivate,deep);
  (this->super_QDomNodePrivate)._vptr_QDomNodePrivate =
       (_func_int **)&PTR__QDomEntityPrivate_00127440;
  (this->m_sys).d.d = (Data *)0x0;
  (this->m_sys).d.ptr = (char16_t *)0x0;
  (this->m_sys).d.size = 0;
  (this->m_pub).d.d = (Data *)0x0;
  (this->m_pub).d.ptr = (char16_t *)0x0;
  (this->m_pub).d.size = 0;
  (this->m_notationName).d.d = (Data *)0x0;
  (this->m_notationName).d.ptr = (char16_t *)0x0;
  (this->m_notationName).d.size = 0;
  QString::operator=(&this->m_sys,&n->m_sys);
  QString::operator=(&this->m_pub,&n->m_pub);
  QString::operator=(&this->m_notationName,&n->m_notationName);
  return;
}

Assistant:

QDomEntityPrivate::QDomEntityPrivate(QDomEntityPrivate* n, bool deep)
    : QDomNodePrivate(n, deep)
{
    m_sys = n->m_sys;
    m_pub = n->m_pub;
    m_notationName = n->m_notationName;
}